

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O2

int Abc_SclCheckOverlap(Abc_Ntk_t *pNtk,Vec_Int_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int Fill;
  int i;
  Vec_Int_t *p;
  
  i = 0;
  do {
    if (vNodes->nSize <= i) {
      return 0;
    }
    iVar1 = Vec_IntEntry(vNodes,i);
    pAVar2 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      p = &pAVar2->pNtk->vTravIds;
      iVar1 = pAVar2->Id;
      Vec_IntFillExtra(p,iVar1 + 1,Fill);
      iVar1 = Vec_IntEntry(p,iVar1);
      if (iVar1 == pAVar2->pNtk->nTravIds) {
        return 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_SclCheckOverlap( Abc_Ntk_t * pNtk, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObjVec( vNodes, pNtk, pObj, i )
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            return 1;
    return 0;
}